

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

void __thiscall Potassco::TheoryData::Data::Data(Data *this)

{
  RawStack<Potassco::TheoryAtom_*>::RawStack(&this->atoms);
  RawStack<Potassco::TheoryElement_*>::RawStack(&this->elems);
  RawStack<Potassco::TheoryTerm>::RawStack(&this->terms);
  (this->frame).atom = 0;
  (this->frame).term = 0;
  (this->frame).elem = 0;
  return;
}

Assistant:

RawStack() : top(0) {}